

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ppmd7.c
# Opt level: O0

void RestartModel(CPpmd7 *p)

{
  ushort uVar1;
  CPpmd_State *p_00;
  short *psVar2;
  long lVar3;
  long *in_RDI;
  CPpmd_See *s_1;
  UInt16 val;
  UInt16 *dest;
  CPpmd_State *s;
  uint m;
  uint k;
  uint i;
  int local_3c;
  uint local_14;
  uint local_10;
  uint local_c;
  
  memset((void *)((long)in_RDI + 0x114),0,0x98);
  in_RDI[0xb] = in_RDI[8] + (ulong)*(uint *)(in_RDI + 0xd);
  in_RDI[10] = in_RDI[0xb] + (ulong)*(uint *)((long)in_RDI + 0x34);
  lVar3 = in_RDI[10] - (ulong)((*(uint *)((long)in_RDI + 0x34) / 0x60) * 0x54);
  in_RDI[0xc] = lVar3;
  in_RDI[9] = lVar3;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)(in_RDI + 3) = *(undefined4 *)((long)in_RDI + 0x24);
  if (*(uint *)((long)in_RDI + 0x24) < 0xc) {
    local_3c = *(int *)((long)in_RDI + 0x24);
  }
  else {
    local_3c = 0xc;
  }
  *(int *)(in_RDI + 6) = -1 - local_3c;
  *(int *)((long)in_RDI + 0x2c) = -1 - local_3c;
  *(undefined4 *)(in_RDI + 4) = 0;
  lVar3 = in_RDI[10] + -0xc;
  in_RDI[10] = lVar3;
  in_RDI[1] = lVar3;
  *in_RDI = lVar3;
  *(undefined4 *)(*in_RDI + 8) = 0;
  *(undefined2 *)*in_RDI = 0x100;
  *(undefined2 *)(*in_RDI + 2) = 0x101;
  in_RDI[2] = in_RDI[9];
  in_RDI[9] = in_RDI[9] + 0x600;
  *(int *)(*in_RDI + 4) = (int)in_RDI[2] - (int)in_RDI[8];
  for (local_c = 0; local_c < 0x100; local_c = local_c + 1) {
    p_00 = (CPpmd_State *)(in_RDI[2] + (ulong)local_c * 6);
    p_00->Symbol = (Byte)local_c;
    p_00->Freq = '\x01';
    SetSuccessor(p_00,0);
  }
  for (local_c = 0; local_c < 0x80; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 8; local_10 = local_10 + 1) {
      uVar1 = kInitBinEsc[local_10];
      for (local_14 = 0; local_14 < 0x40; local_14 = local_14 + 8) {
        *(short *)((long)in_RDI +
                  (ulong)local_14 * 2 + (ulong)local_10 * 2 + (ulong)local_c * 0x80 + 0xaf0) =
             0x4000 - (short)((uint)uVar1 / (local_c + 2));
      }
    }
  }
  for (local_c = 0; local_c < 0x19; local_c = local_c + 1) {
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      psVar2 = (short *)((long)in_RDI + (ulong)local_10 * 4 + (ulong)local_c * 0x40 + 0x4b0);
      *(undefined1 *)(psVar2 + 1) = 3;
      *psVar2 = ((short)local_c * 5 + 10) * 8;
      *(undefined1 *)((long)psVar2 + 3) = 4;
    }
  }
  return;
}

Assistant:

static void RestartModel(CPpmd7 *p)
{
  unsigned i, k, m;

  memset(p->FreeList, 0, sizeof(p->FreeList));
  p->Text = p->Base + p->AlignOffset;
  p->HiUnit = p->Text + p->Size;
  p->LoUnit = p->UnitsStart = p->HiUnit - p->Size / 8 / UNIT_SIZE * 7 * UNIT_SIZE;
  p->GlueCount = 0;

  p->OrderFall = p->MaxOrder;
  p->RunLength = p->InitRL = -(Int32)((p->MaxOrder < 12) ? p->MaxOrder : 12) - 1;
  p->PrevSuccess = 0;

  p->MinContext = p->MaxContext = (CTX_PTR)(p->HiUnit -= UNIT_SIZE); /* AllocContext(p); */
  p->MinContext->Suffix = 0;
  p->MinContext->NumStats = 256;
  p->MinContext->SummFreq = 256 + 1;
  p->FoundState = (CPpmd_State *)p->LoUnit; /* AllocUnits(p, PPMD_NUM_INDEXES - 1); */
  p->LoUnit += U2B(256 / 2);
  p->MinContext->Stats = REF(p->FoundState);
  for (i = 0; i < 256; i++)
  {
    CPpmd_State *s = &p->FoundState[i];
    s->Symbol = (Byte)i;
    s->Freq = 1;
    SetSuccessor(s, 0);
  }

  for (i = 0; i < 128; i++)
    for (k = 0; k < 8; k++)
    {
      UInt16 *dest = p->BinSumm[i] + k;
      UInt16 val = (UInt16)(PPMD_BIN_SCALE - kInitBinEsc[k] / (i + 2));
      for (m = 0; m < 64; m += 8)
        dest[m] = val;
    }
  
  for (i = 0; i < 25; i++)
    for (k = 0; k < 16; k++)
    {
      CPpmd_See *s = &p->See[i][k];
      s->Summ = (UInt16)((5 * i + 10) << (s->Shift = PPMD_PERIOD_BITS - 4));
      s->Count = 4;
    }
}